

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_function-c.cpp
# Opt level: O2

void __thiscall duckdb::CCastFunctionUserData::~CCastFunctionUserData(CCastFunctionUserData *this)

{
  if ((this->data_ptr != (duckdb_function_info)0x0) &&
     (this->delete_callback != (duckdb_delete_callback_t)0x0)) {
    (*this->delete_callback)(this->data_ptr);
  }
  this->data_ptr = (duckdb_function_info)0x0;
  this->delete_callback = (duckdb_delete_callback_t)0x0;
  return;
}

Assistant:

~CCastFunctionUserData() {
		if (data_ptr && delete_callback) {
			delete_callback(data_ptr);
		}
		data_ptr = nullptr;
		delete_callback = nullptr;
	}